

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1c02d::CpuTest_lax_indirect_indexed_Test::TestBody
          (CpuTest_lax_indirect_indexed_Test *this)

{
  NiceMock<n_e_s::core::test::MockMmu> *this_00;
  CpuRegisters *pCVar1;
  int iVar2;
  TypedExpectation<unsigned_char_(unsigned_short)> *pTVar3;
  int *piVar4;
  ActionInterface<unsigned_char_(unsigned_short)> *pAVar5;
  char cVar6;
  _func_int *message;
  AssertionResult gtest_ar;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _Any_data local_80;
  code *local_70;
  undefined1 local_60 [8];
  MatcherBase<unsigned_short> local_58;
  MatcherBase<unsigned_short> local_40;
  
  (this->super_CpuTest).expected.pc = 0x4321;
  (this->super_CpuTest).registers.pc = 0x4321;
  (this->super_CpuTest).expected.y = '\r';
  (this->super_CpuTest).registers.y = '\r';
  (this->super_CpuTest).expected.a = 'B';
  (this->super_CpuTest).expected.x = 'B';
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,0xb3);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 1;
  this_00 = &(this->super_CpuTest).mmu;
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0x4322);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x205,"mmu","read_byte(0x4322)");
  piVar4 = (int *)operator_new(4);
  *piVar4 = 0x42;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar4);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *piVar4;
  *(int *)&pAVar5[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar5[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0x42);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x206,"mmu","read_byte(0x42)");
  piVar4 = (int *)operator_new(4);
  *piVar4 = 0x34;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar4);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *piVar4;
  *(int *)&pAVar5[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar5[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0x43);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x207,"mmu","read_byte(0x43)");
  piVar4 = (int *)operator_new(4);
  *piVar4 = 0x12;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar4);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *piVar4;
  *(int *)&pAVar5[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar5[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  testing::Matcher<unsigned_short>::Matcher((Matcher<unsigned_short> *)&local_40,0x1241);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,&this_00->super_MockMmu,
             (Matcher<unsigned_short> *)&local_40);
  testing::internal::GetWithoutMatchers();
  pTVar3 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                     ((MockSpec<unsigned_char_(unsigned_short)> *)local_60,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
                      ,0x209,"mmu","read_byte(0x1234 + 0x0D)");
  piVar4 = (int *)operator_new(4);
  *piVar4 = 0x42;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_88,piVar4);
  pAVar5 = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  pAVar5->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a10a0;
  iVar2 = *piVar4;
  *(int *)&pAVar5[1]._vptr_ActionInterface = iVar2;
  *(char *)((long)&pAVar5[1]._vptr_ActionInterface + 4) = (char)iVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_80,pAVar5);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (pTVar3,(Action<unsigned_char_(unsigned_short)> *)&local_80);
  if (local_70 != (code *)0x0) {
    (*local_70)(&local_80,&local_80,__destroy_functor);
  }
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_40);
  cVar6 = '\x05';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar6 = cVar6 + -1;
  } while (cVar6 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_60,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_60[0] == '\0') {
    testing::Message::Message((Message *)&local_80);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu.cpp"
               ,0x20c,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((long *)local_80._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_80._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_60)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_58.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

TEST_F(CpuTest, lax_indirect_indexed) {
    registers.pc = expected.pc = 0x4321;
    registers.y = expected.y = 0x0D;
    expected.a = 0x42;
    expected.x = 0x42;

    stage_instruction(LAX_INDINX);
    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(0x4322)).WillOnce(Return(0x42));
    EXPECT_CALL(mmu, read_byte(0x42)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(0x43)).WillOnce(Return(0x12));

    EXPECT_CALL(mmu, read_byte(0x1234 + 0x0D)).WillOnce(Return(0x42));
    step_execution(5);

    EXPECT_EQ(expected, registers);
}